

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZPardisoSolver.cpp
# Opt level: O0

void __thiscall
TPZPardisoSolver<std::complex<long_double>_>::~TPZPardisoSolver
          (TPZPardisoSolver<std::complex<long_double>_> *this)

{
  void *in_RDI;
  
  ~TPZPardisoSolver((TPZPardisoSolver<std::complex<long_double>_> *)0x117a458);
  operator_delete(in_RDI,0x338);
  return;
}

Assistant:

TPZPardisoSolver<TVar>::~TPZPardisoSolver()
{
#ifdef USING_MKL
    long long phase = -1;
    long long n=1;
    long long av,bv,xv;
    void *a= &av,*b = &bv, *x = &xv;
    long long ia,ja,perm,nrhs = 1;
    long long Error = 0;
    if(fPardisoInitialized)
        pardiso_64 (fHandle,  &fMax_num_factors, &fMatrix_num, &fMatrixType,
                    &phase, &n, a, &ia, &ja, &perm,
                    &nrhs, &fParam[0], &fMessageLevel, b, x, &Error);
    
    if (Error) {
        DebugStop();
    }
#endif
    //we should NOT delete fSymmetricSystem and fNonSymmetricSystem
}